

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_pushloc(lua_State *L,GCproto *pt,BCPos pc)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  BCPos in_EDX;
  GCproto *in_RSI;
  lua_State *in_RDI;
  BCLine line;
  MSize len;
  MSize i;
  char *s;
  GCstr *name;
  uint local_2c;
  long local_28;
  
  uVar3 = (ulong)(in_RSI->chunkname).gcptr32;
  pcVar4 = (char *)(uVar3 + 0x10);
  local_2c = *(uint *)(uVar3 + 0xc);
  uVar2 = lj_debug_line(in_RSI,in_EDX);
  if (in_RSI->firstline == -1) {
    lj_strfmt_pushf(in_RDI,"builtin:%s",pcVar4);
  }
  else if (*pcVar4 == '@') {
    local_28 = uVar3 + 0x11;
    do {
      uVar1 = local_2c;
      local_2c = uVar1 - 1;
      if (local_2c == 0) goto LAB_001166c7;
    } while ((*(char *)(local_28 + (ulong)local_2c) != '/') &&
            (*(char *)(local_28 + (ulong)local_2c) != '\\'));
    local_28 = local_28 + (ulong)uVar1;
LAB_001166c7:
    lj_strfmt_pushf(in_RDI,"%s:%d",local_28,(ulong)uVar2);
  }
  else if (local_2c < 0x29) {
    if (*pcVar4 == '=') {
      lj_strfmt_pushf(in_RDI,"%s:%d",uVar3 + 0x11,(ulong)uVar2);
    }
    else {
      lj_strfmt_pushf(in_RDI,"\"%s\":%d",pcVar4,(ulong)uVar2);
    }
  }
  else {
    lj_strfmt_pushf(in_RDI,"%p:%d",in_RSI,(ulong)uVar2);
  }
  return;
}

Assistant:

void lj_debug_pushloc(lua_State *L, GCproto *pt, BCPos pc)
{
  GCstr *name = proto_chunkname(pt);
  const char *s = strdata(name);
  MSize i, len = name->len;
  BCLine line = lj_debug_line(pt, pc);
  if (pt->firstline == ~(BCLine)0) {
    lj_strfmt_pushf(L, "builtin:%s", s);
  } else if (*s == '@') {
    s++; len--;
    for (i = len; i > 0; i--)
      if (s[i] == '/' || s[i] == '\\') {
	s += i+1;
	break;
      }
    lj_strfmt_pushf(L, "%s:%d", s, line);
  } else if (len > 40) {
    lj_strfmt_pushf(L, "%p:%d", pt, line);
  } else if (*s == '=') {
    lj_strfmt_pushf(L, "%s:%d", s+1, line);
  } else {
    lj_strfmt_pushf(L, "\"%s\":%d", s, line);
  }
}